

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

int __thiscall CChat::NextActiveCommand(CChat *this,int *pIndex)

{
  bool *pbVar1;
  int iVar2;
  long lVar3;
  
  pbVar1 = (this->m_aFilter).list;
  lVar3 = (long)*pIndex;
  do {
    lVar3 = lVar3 + 1;
    iVar2 = (int)lVar3;
    *pIndex = iVar2;
    if ((this->m_aFilter).num_elements <= iVar2) {
      return iVar2;
    }
  } while (pbVar1[lVar3] != false);
  return iVar2;
}

Assistant:

int CChat::NextActiveCommand(int *pIndex)
{
	(*pIndex)++;
	while(*pIndex < m_aFilter.size() && m_aFilter[*pIndex])
		(*pIndex)++;
	return *pIndex;
}